

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O0

String * Rct::colorize(String *__return_storage_ptr__,String *string,AnsiColor color,size_t from,
                      size_t len)

{
  size_t sVar1;
  char *local_50;
  char *str;
  size_t local_30;
  size_t len_local;
  size_t from_local;
  AnsiColor color_local;
  String *string_local;
  String *ret;
  
  sVar1 = String::size(string);
  if (sVar1 < from) {
    __assert_fail("from <= string.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp",
                  0x1b7,"String Rct::colorize(const String &, AnsiColor, size_t, size_t)");
  }
  local_30 = len;
  if (len == 0xffffffffffffffff) {
    local_30 = String::size(string);
    local_30 = local_30 - from;
  }
  sVar1 = String::size(string);
  if (from + local_30 <= sVar1) {
    if (local_30 == 0) {
      String::String(__return_storage_ptr__,string);
    }
    else {
      String::String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
      sVar1 = String::size(string);
      String::reserve(__return_storage_ptr__,sVar1 + 0x14);
      local_50 = String::constData(string);
      if (from != 0) {
        String::append(__return_storage_ptr__,local_50,from);
        local_50 = local_50 + from;
      }
      String::append(__return_storage_ptr__,(&colors)[color],0xffffffffffffffff);
      String::append(__return_storage_ptr__,local_50,local_30);
      String::append(__return_storage_ptr__,colors,0xffffffffffffffff);
      sVar1 = String::size(string);
      if (from + local_30 != sVar1) {
        sVar1 = String::size(string);
        String::append(__return_storage_ptr__,local_50 + local_30,(sVar1 - from) - local_30);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("from + len <= string.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp",
                0x1bb,"String Rct::colorize(const String &, AnsiColor, size_t, size_t)");
}

Assistant:

String colorize(const String &string, AnsiColor color, size_t from, size_t len)
{
    assert(from <= string.size());
    if (len == String::npos) {
        len = string.size() - from;
    }
    assert(from + len <= string.size());
    if (!len)
        return string;

    String ret;
    ret.reserve(string.size() + 20);
    const char *str = string.constData();
    if (from > 0) {
        ret.append(str, from);
        str += from;
    }
    ret.append(colors[color]);
    ret.append(str, len);
    str += len;
    ret.append(colors[AnsiColor_Default]);
    if (from + len != string.size())
        ret.append(str, string.size() - from - len);

    return ret;
}